

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3FinishTrigger(Parse *pParse,TriggerStep *pStepList,Token *pAll)

{
  TriggerStep **ppTVar1;
  sqlite3 *db;
  Schema *pSVar2;
  char *__s;
  Upsert *pUVar3;
  int iVar4;
  TriggerStep *pTVar5;
  size_t sVar6;
  Vdbe *p;
  void *pvVar7;
  char *pcVar8;
  Trigger *pTrigger;
  HashElem *pHVar9;
  Schema **ppSVar10;
  Upsert *pUp;
  Parse *pPVar11;
  ulong __n;
  int iDb;
  Trigger *data;
  DbFixer sFix;
  Token nameToken;
  DbFixer local_70;
  Token local_40;
  
  db = pParse->db;
  pTrigger = pParse->pNewTrigger;
  pParse->pNewTrigger = (Trigger *)0x0;
  if (pTrigger == (Trigger *)0x0 || pParse->nErr != 0) goto LAB_0017cc22;
  if (pTrigger->pSchema == (Schema *)0x0) {
    iDb = -1000000;
  }
  else {
    iDb = -1;
    ppSVar10 = &db->aDb->pSchema;
    do {
      iDb = iDb + 1;
      pSVar2 = *ppSVar10;
      ppSVar10 = ppSVar10 + 4;
    } while (pSVar2 != pTrigger->pSchema);
  }
  __s = pTrigger->zName;
  pTrigger->step_list = pStepList;
  pTVar5 = pStepList;
  if (pStepList != (TriggerStep *)0x0) {
    do {
      pTVar5->pTrig = pTrigger;
      ppTVar1 = &pTVar5->pNext;
      pTVar5 = *ppTVar1;
    } while (*ppTVar1 != (TriggerStep *)0x0);
  }
  local_40.z = __s;
  if (__s == (char *)0x0) {
    local_40.n = 0;
  }
  else {
    sVar6 = strlen(__s);
    local_40.n = (uint)sVar6 & 0x3fffffff;
  }
  local_70.pName = &local_40;
  local_70.zDb = db->aDb[iDb].zDbSName;
  local_70.pSchema = db->aDb[iDb].pSchema;
  local_70.zType = "trigger";
  local_70.bVarOnly = (int)(iDb == 1);
  local_70.pParse = pParse;
  if (pStepList != (TriggerStep *)0x0) {
    do {
      iVar4 = sqlite3FixSelect(&local_70,pStepList->pSelect);
      if ((((iVar4 != 0) || (iVar4 = sqlite3FixExpr(&local_70,pStepList->pWhere), iVar4 != 0)) ||
          (iVar4 = sqlite3FixExprList(&local_70,pStepList->pExprList), iVar4 != 0)) ||
         ((pUVar3 = pStepList->pUpsert, pUVar3 != (Upsert *)0x0 &&
          (((iVar4 = sqlite3FixExprList(&local_70,pUVar3->pUpsertTarget), iVar4 != 0 ||
            (iVar4 = sqlite3FixExpr(&local_70,pUVar3->pUpsertTargetWhere), iVar4 != 0)) ||
           ((iVar4 = sqlite3FixExprList(&local_70,pUVar3->pUpsertSet), iVar4 != 0 ||
            (iVar4 = sqlite3FixExpr(&local_70,pUVar3->pUpsertWhere), iVar4 != 0))))))))
      goto LAB_0017cc1d;
      pStepList = pStepList->pNext;
    } while (pStepList != (TriggerStep *)0x0);
  }
  iVar4 = sqlite3FixExpr(&local_70,pTrigger->pWhen);
  if (iVar4 == 0) {
    if (pParse->eParseMode < 2) {
      data = pTrigger;
      if ((db->init).busy != '\0') goto LAB_0017cd89;
      p = sqlite3GetVdbe(pParse);
      if (p != (Vdbe *)0x0) {
        pPVar11 = pParse->pToplevel;
        if (pParse->pToplevel == (Parse *)0x0) {
          pPVar11 = pParse;
        }
        sqlite3CodeVerifySchema(pParse,iDb);
        pPVar11->writeMask = pPVar11->writeMask | 1 << ((byte)iDb & 0x1f);
        pcVar8 = pAll->z;
        if (pcVar8 == (char *)0x0) {
LAB_0017cce9:
          pvVar7 = (void *)0x0;
        }
        else {
          __n = (ulong)pAll->n;
          pvVar7 = sqlite3DbMallocRawNN(db,__n + 1);
          if (pvVar7 == (void *)0x0) goto LAB_0017cce9;
          memcpy(pvVar7,pcVar8,__n);
          *(undefined1 *)((long)pvVar7 + __n) = 0;
        }
        sqlite3NestedParse(pParse,
                           "INSERT INTO %Q.%s VALUES(\'trigger\',%Q,%Q,0,\'CREATE TRIGGER %q\')",
                           db->aDb[iDb].zDbSName,"sqlite_master",__s,pTrigger->table,pvVar7);
        if (pvVar7 != (void *)0x0) {
          sqlite3DbFreeNN(db,pvVar7);
        }
        sqlite3VdbeAddOp3(pParse->pVdbe,0x5f,iDb,1,(pParse->db->aDb[iDb].pSchema)->schema_cookie + 1
                         );
        pcVar8 = sqlite3MPrintf(db,"type=\'trigger\' AND name=\'%q\'",__s);
        sqlite3VdbeAddParseSchemaOp(p,iDb,pcVar8);
        goto LAB_0017cd89;
      }
    }
    else {
      pParse->pNewTrigger = pTrigger;
      data = (Trigger *)0x0;
LAB_0017cd89:
      pTrigger = data;
      if ((db->init).busy != '\0') {
        pTrigger = (Trigger *)sqlite3HashInsert(&(db->aDb[iDb].pSchema)->trigHash,__s,data);
        if (pTrigger != (Trigger *)0x0) {
          sqlite3OomFault(db);
          pStepList = (TriggerStep *)0x0;
          goto LAB_0017cc22;
        }
        if (data->pSchema == data->pTabSchema) {
          pHVar9 = findElementWithHash(&data->pTabSchema->tblHash,data->table,(uint *)0x0);
          pvVar7 = pHVar9->data;
          data->pNext = *(Trigger **)((long)pvVar7 + 0x68);
          *(Trigger **)((long)pvVar7 + 0x68) = data;
          pTrigger = (Trigger *)0x0;
        }
        else {
          pTrigger = (Trigger *)0x0;
        }
        goto LAB_0017cc1d;
      }
    }
    pStepList = (TriggerStep *)0x0;
  }
  else {
LAB_0017cc1d:
    pStepList = (TriggerStep *)0x0;
  }
LAB_0017cc22:
  sqlite3DeleteTrigger(db,pTrigger);
  sqlite3DeleteTriggerStep(db,pStepList);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3FinishTrigger(
  Parse *pParse,          /* Parser context */
  TriggerStep *pStepList, /* The triggered program */
  Token *pAll             /* Token that describes the complete CREATE TRIGGER */
){
  Trigger *pTrig = pParse->pNewTrigger;   /* Trigger being finished */
  char *zName;                            /* Name of trigger */
  sqlite3 *db = pParse->db;               /* The database */
  DbFixer sFix;                           /* Fixer object */
  int iDb;                                /* Database containing the trigger */
  Token nameToken;                        /* Trigger name for error reporting */

  pParse->pNewTrigger = 0;
  if( NEVER(pParse->nErr) || !pTrig ) goto triggerfinish_cleanup;
  zName = pTrig->zName;
  iDb = sqlite3SchemaToIndex(pParse->db, pTrig->pSchema);
  pTrig->step_list = pStepList;
  while( pStepList ){
    pStepList->pTrig = pTrig;
    pStepList = pStepList->pNext;
  }
  sqlite3TokenInit(&nameToken, pTrig->zName);
  sqlite3FixInit(&sFix, pParse, iDb, "trigger", &nameToken);
  if( sqlite3FixTriggerStep(&sFix, pTrig->step_list) 
   || sqlite3FixExpr(&sFix, pTrig->pWhen) 
  ){
    goto triggerfinish_cleanup;
  }

#ifndef SQLITE_OMIT_ALTERTABLE
  if( IN_RENAME_OBJECT ){
    assert( !db->init.busy );
    pParse->pNewTrigger = pTrig;
    pTrig = 0;
  }else
#endif

  /* if we are not initializing,
  ** build the sqlite_master entry
  */
  if( !db->init.busy ){
    Vdbe *v;
    char *z;

    /* Make an entry in the sqlite_master table */
    v = sqlite3GetVdbe(pParse);
    if( v==0 ) goto triggerfinish_cleanup;
    sqlite3BeginWriteOperation(pParse, 0, iDb);
    z = sqlite3DbStrNDup(db, (char*)pAll->z, pAll->n);
    testcase( z==0 );
    sqlite3NestedParse(pParse,
       "INSERT INTO %Q.%s VALUES('trigger',%Q,%Q,0,'CREATE TRIGGER %q')",
       db->aDb[iDb].zDbSName, MASTER_NAME, zName,
       pTrig->table, z);
    sqlite3DbFree(db, z);
    sqlite3ChangeCookie(pParse, iDb);
    sqlite3VdbeAddParseSchemaOp(v, iDb,
        sqlite3MPrintf(db, "type='trigger' AND name='%q'", zName));
  }

  if( db->init.busy ){
    Trigger *pLink = pTrig;
    Hash *pHash = &db->aDb[iDb].pSchema->trigHash;
    assert( sqlite3SchemaMutexHeld(db, iDb, 0) );
    pTrig = sqlite3HashInsert(pHash, zName, pTrig);
    if( pTrig ){
      sqlite3OomFault(db);
    }else if( pLink->pSchema==pLink->pTabSchema ){
      Table *pTab;
      pTab = sqlite3HashFind(&pLink->pTabSchema->tblHash, pLink->table);
      assert( pTab!=0 );
      pLink->pNext = pTab->pTrigger;
      pTab->pTrigger = pLink;
    }
  }

triggerfinish_cleanup:
  sqlite3DeleteTrigger(db, pTrig);
  assert( IN_RENAME_OBJECT || !pParse->pNewTrigger );
  sqlite3DeleteTriggerStep(db, pStepList);
}